

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O1

void __thiscall xe::ContainerFormatParser::~ContainerFormatParser(ContainerFormatParser *this)

{
  uchar *puVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  puVar1 = (this->m_buf).m_buffer;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
  }
  pcVar2 = (this->m_value)._M_dataplus._M_p;
  paVar3 = &(this->m_value).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_attribute)._M_dataplus._M_p;
  paVar3 = &(this->m_attribute).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ContainerFormatParser::~ContainerFormatParser (void)
{
}